

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
* __thiscall adios2::core::Engine::DoBlocksInfo(Engine *this,Variable<double> *variable,size_t step)

{
  vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
  *in_RDI;
  string *in_stack_00000098;
  Engine *in_stack_000000a0;
  allocator local_41;
  string local_40 [64];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"DoBlocksInfo",&local_41);
  ThrowUp(in_stack_000000a0,in_stack_00000098);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  memset(in_RDI,0,0x18);
  std::
  vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
  ::vector((vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
            *)0x853643);
  return in_RDI;
}

Assistant:

std::map<size_t, std::vector<VariableStruct::BPInfo>>
Engine::DoAllStepsBlocksInfoStruct(const VariableStruct &variable) const
{
    ThrowUp("DoAllStepsBlocksInfo");
    return std::map<size_t, std::vector<VariableStruct::BPInfo>>();
}